

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O3

void __thiscall QObject::dumpObjectInfo(QObject *this)

{
  QBasicMutex *this_00;
  __pointer_type copy;
  QObjectData *pQVar1;
  QObject *pQVar2;
  qsizetype qVar3;
  int iVar4;
  undefined4 extraout_var;
  char *pcVar5;
  undefined4 extraout_var_00;
  char *pcVar6;
  QObject *pQVar7;
  undefined4 extraout_var_01;
  QMetaObject *this_01;
  ulong uVar8;
  QChar *extraout_RDX;
  __sighandler_t __handler;
  QArrayData *data;
  char *pcVar9;
  QObject *pQVar10;
  _func_int **pp_Var11;
  long in_FS_OFFSET;
  bool bVar12;
  QString local_118;
  QByteArray local_100;
  QString local_e8;
  QByteArray local_d0;
  QMetaMethod local_b8;
  QString local_a8;
  QByteArray local_90;
  QString local_78;
  QMessageLogger local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.context.version = 2;
  local_58.context.line = 0;
  local_58.context.file._0_4_ = 0;
  local_58.context.file._4_4_ = 0;
  local_58.context.function._0_4_ = 0;
  local_58.context.function._4_4_ = 0;
  local_58.context.category = "default";
  iVar4 = (**this->_vptr_QObject)();
  pcVar5 = QMetaObject::className((QMetaObject *)CONCAT44(extraout_var,iVar4));
  objectName(&local_78,this);
  qVar3 = local_78.d.size;
  if (local_78.d.size == 0) {
    local_90.d.ptr = "unnamed";
  }
  else {
    objectName(&local_a8,this);
    QString::toLocal8Bit_helper(&local_90,(QChar *)local_a8.d.ptr,local_a8.d.size);
    if ((&(local_90.d.d)->super_QArrayData == (QArrayData *)0x0) ||
       (1 < ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      QByteArray::reallocData(&local_90,local_90.d.size,KeepSize);
    }
  }
  QMessageLogger::debug(&local_58,"OBJECT %s::%s",pcVar5,local_90.d.ptr);
  if (qVar3 != 0) {
    if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar1 = (this->d_ptr).d;
  uVar8 = (ulong)(uint)((int)this + (int)(((ulong)this & 0xffffffff) / 0x418) * -0x418);
  this_00 = (QBasicMutex *)((long)&_q_ObjectMutexPool[0].d_ptr._q_value._M_b._M_p + uVar8);
  if (*(long *)((long)&_q_ObjectMutexPool[0].d_ptr._q_value._M_b._M_p + uVar8) == 0) {
    LOCK();
    bVar12 = (this_00->d_ptr)._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar12) {
      (this_00->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar12) goto LAB_002b69a5;
  }
  QBasicMutex::lockInternal(this_00);
LAB_002b69a5:
  local_58.context.version = 2;
  local_58.context.line = 0;
  local_58.context.file._0_4_ = 0;
  local_58.context.file._4_4_ = 0;
  local_58.context.function._0_4_ = 0;
  local_58.context.function._4_4_ = 0;
  local_58.context.category = "default";
  QMessageLogger::debug(&local_58,"  SIGNALS OUT");
  pQVar2 = pQVar1[1].parent;
  if (((pQVar2 == (QObject *)0x0) || ((pQVar2->d_ptr).d == (QObjectData *)0x0)) ||
     (*(int *)&((pQVar2->d_ptr).d)->q_ptr < 1)) {
    local_58.context.version = 2;
    local_58.context.line = 0;
    local_58.context.file._0_4_ = 0;
    local_58.context.file._4_4_ = 0;
    local_58.context.function._0_4_ = 0;
    local_58.context.function._4_4_ = 0;
    local_58.context.category = "default";
    QMessageLogger::debug(&local_58,"        <None>");
  }
  else {
    pQVar1 = (pQVar2->d_ptr).d;
    pQVar7 = pQVar1->q_ptr;
    if (0 < (int)pQVar7) {
      __handler = (__sighandler_t)0x0;
      do {
        pQVar10 = (QObject *)(&(pQVar1->children).d.ptr)[(long)__handler * 2];
        if (pQVar10 != (QObject *)0x0) {
          local_118.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_118.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          iVar4 = (**this->_vptr_QObject)();
          local_118.d.d = (Data *)QMetaObjectPrivate::signal(iVar4,__handler);
          local_58.context.version = 2;
          local_58.context.line = 0;
          local_58.context.file._0_4_ = 0;
          local_58.context.file._4_4_ = 0;
          local_58.context.function._0_4_ = 0;
          local_58.context.function._4_4_ = 0;
          local_58.context.category = "default";
          local_118.d.ptr = &extraout_RDX->ucs;
          QMetaMethod::methodSignature((QByteArray *)&local_78,(QMetaMethod *)&local_118);
          pcVar5 = (char *)local_78.d.ptr;
          if (local_78.d.ptr == (char16_t *)0x0) {
            pcVar5 = &QByteArray::_empty;
          }
          QMessageLogger::debug(&local_58,"        signal: %s",pcVar5);
          if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
            }
          }
          do {
            if (pQVar10[2].d_ptr.d == (QObjectData *)0x0) {
              local_58.context.version = 2;
              local_58.context.line = 0;
              local_58.context.file._0_4_ = 0;
              local_58.context.file._4_4_ = 0;
              local_58.context.function._0_4_ = 0;
              local_58.context.function._4_4_ = 0;
              local_58.context.category = "default";
              QMessageLogger::debug(&local_58,"          <Disconnected receiver>");
            }
            else if (((ulong)pQVar10[5]._vptr_QObject & 0x2000000000000000) == 0) {
              iVar4 = (**(pQVar10[2].d_ptr.d)->_vptr_QObjectData)();
              local_b8.data.d = (uint *)&DAT_aaaaaaaaaaaaaaaa;
              local_b8.mobj = (QMetaObject *)&DAT_aaaaaaaaaaaaaaaa;
              local_b8 = QMetaObject::method((QMetaObject *)CONCAT44(extraout_var_00,iVar4),
                                             (uint)*(ushort *)((long)&pQVar10[5]._vptr_QObject + 2)
                                             + (uint)*(ushort *)&pQVar10[5]._vptr_QObject);
              local_58.context.version = 2;
              local_58.context.line = 0;
              local_58.context.file._0_4_ = 0;
              local_58.context.file._4_4_ = 0;
              local_58.context.function._0_4_ = 0;
              local_58.context.function._4_4_ = 0;
              local_58.context.category = "default";
              pcVar6 = QMetaObject::className((QMetaObject *)CONCAT44(extraout_var_00,iVar4));
              objectName(&local_78,(QObject *)pQVar10[2].d_ptr.d);
              qVar3 = local_78.d.size;
              pcVar5 = "unnamed";
              if (local_78.d.size != 0) {
                objectName(&local_e8,(QObject *)pQVar10[2].d_ptr.d);
                QString::toLocal8Bit_helper(&local_d0,(QChar *)local_e8.d.ptr,local_e8.d.size);
                pcVar5 = local_d0.d.ptr;
                if (local_d0.d.ptr == (char *)0x0) {
                  pcVar5 = &QByteArray::_empty;
                }
              }
              QMetaMethod::methodSignature(&local_100,&local_b8);
              pcVar9 = local_100.d.ptr;
              if (local_100.d.ptr == (char *)0x0) {
                pcVar9 = &QByteArray::_empty;
              }
              QMessageLogger::debug(&local_58,"          --> %s::%s %s",pcVar6,pcVar5,pcVar9);
              if (&(local_100.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_100.d.d)->super_QArrayData,1,0x10);
                }
              }
              if (qVar3 != 0) {
                if (&(local_d0.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_d0.d.d)->super_QArrayData,1,0x10);
                  }
                }
                if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
                  }
                }
              }
              if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
                }
              }
            }
            else {
              local_58.context.version = 2;
              local_58.context.line = 0;
              local_58.context.file._0_4_ = 0;
              local_58.context.file._4_4_ = 0;
              local_58.context.function._0_4_ = 0;
              local_58.context.function._4_4_ = 0;
              local_58.context.category = "default";
              QMessageLogger::debug(&local_58,"          <functor or function pointer>");
            }
            pQVar10 = (QObject *)pQVar10[1]._vptr_QObject;
          } while (pQVar10 != (QObject *)0x0);
          pQVar7 = pQVar1->q_ptr;
        }
        __handler = __handler + 1;
      } while ((long)__handler < (long)(int)pQVar7);
    }
  }
  local_58.context.version = 2;
  local_58.context.line = 0;
  local_58.context.file._0_4_ = 0;
  local_58.context.file._4_4_ = 0;
  local_58.context.function._0_4_ = 0;
  local_58.context.function._4_4_ = 0;
  local_58.context.category = "default";
  QMessageLogger::debug(&local_58,"  SIGNALS IN");
  if ((pQVar2 == (QObject *)0x0) ||
     (pp_Var11 = pQVar2[1]._vptr_QObject, pp_Var11 == (_func_int **)0x0)) {
    local_58.context.version = 2;
    local_58.context.line = 0;
    local_58.context.file._0_4_ = 0;
    local_58.context.file._4_4_ = 0;
    local_58.context.function._0_4_ = 0;
    local_58.context.function._4_4_ = 0;
    local_58.context.category = "default";
    QMessageLogger::debug(&local_58,"        <None>");
  }
  else {
    do {
      if ((*(byte *)((long)pp_Var11 + 0x57) & 0x20) == 0) {
        local_78.d.ptr._0_4_ = 0xaaaaaaaa;
        local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_78.d.ptr._4_4_ = 0xaaaaaaaa;
        iVar4 = (**this->_vptr_QObject)();
        local_78.d._0_16_ =
             QMetaObject::method((QMetaObject *)CONCAT44(extraout_var_01,iVar4),
                                 (uint)*(ushort *)((long)pp_Var11 + 0x52) +
                                 (uint)*(ushort *)(pp_Var11 + 10));
        QMetaMethod::methodSignature((QByteArray *)&local_58,(QMetaMethod *)&local_78);
        data = (QArrayData *)CONCAT44(local_58.context.line,local_58.context.version);
        pcVar5 = (char *)CONCAT44(local_58.context.file._4_4_,local_58.context.file._0_4_);
      }
      else {
        pcVar5 = "<unknown>";
        data = (QArrayData *)0x0;
      }
      local_58.context.version = 2;
      local_58.context.line = 0;
      local_58.context.file._0_4_ = 0;
      local_58.context.file._4_4_ = 0;
      local_58.context.function._0_4_ = 0;
      local_58.context.function._4_4_ = 0;
      local_58.context.category = "default";
      this_01 = (QMetaObject *)(*(code *)**(undefined8 **)pp_Var11[4])();
      pcVar9 = QMetaObject::className(this_01);
      objectName(&local_78,(QObject *)pp_Var11[4]);
      qVar3 = local_78.d.size;
      pcVar6 = "unnamed";
      if (local_78.d.size != 0) {
        objectName(&local_118,(QObject *)pp_Var11[4]);
        QString::toLocal8Bit_helper(&local_100,(QChar *)local_118.d.ptr,local_118.d.size);
        pcVar6 = local_100.d.ptr;
        if (local_100.d.ptr == (char *)0x0) {
          pcVar6 = &QByteArray::_empty;
        }
      }
      if (pcVar5 == (char *)0x0) {
        pcVar5 = &QByteArray::_empty;
      }
      QMessageLogger::debug(&local_58,"          <-- %s::%s %s",pcVar9,pcVar6,pcVar5);
      if (qVar3 != 0) {
        if (&(local_100.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_100.d.d)->super_QArrayData,1,0x10);
          }
        }
        if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (data != (QArrayData *)0x0) {
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(data,1,0x10);
        }
      }
      pp_Var11 = (_func_int **)*pp_Var11;
    } while (pp_Var11 != (_func_int **)0x0);
  }
  LOCK();
  copy = (this_00->d_ptr)._q_value._M_b._M_p;
  (this_00->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (copy != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(this_00,copy);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QObject::dumpObjectInfo() const
{
    qDebug("OBJECT %s::%s", metaObject()->className(),
           objectName().isEmpty() ? "unnamed" : objectName().toLocal8Bit().data());

    Q_D(const QObject);
    QMutexLocker locker(signalSlotLock(this));

    // first, look for connections where this object is the sender
    qDebug("  SIGNALS OUT");

    QObjectPrivate::ConnectionData *cd = d->connections.loadRelaxed();
    if (cd && cd->signalVectorCount() > 0) {
        QObjectPrivate::SignalVector *signalVector = cd->signalVector.loadRelaxed();
        for (int signal_index = 0; signal_index < signalVector->count(); ++signal_index) {
            const QObjectPrivate::Connection *c = signalVector->at(signal_index).first.loadRelaxed();
            if (!c)
                continue;
            const QMetaMethod signal = QMetaObjectPrivate::signal(metaObject(), signal_index);
            qDebug("        signal: %s", signal.methodSignature().constData());

            // receivers
            while (c) {
                if (!c->receiver.loadRelaxed()) {
                    qDebug("          <Disconnected receiver>");
                    c = c->nextConnectionList.loadRelaxed();
                    continue;
                }
                if (c->isSlotObject) {
                    qDebug("          <functor or function pointer>");
                    c = c->nextConnectionList.loadRelaxed();
                    continue;
                }
                const QMetaObject *receiverMetaObject = c->receiver.loadRelaxed()->metaObject();
                const QMetaMethod method = receiverMetaObject->method(c->method());
                qDebug("          --> %s::%s %s",
                       receiverMetaObject->className(),
                       c->receiver.loadRelaxed()->objectName().isEmpty() ? "unnamed" : qPrintable(c->receiver.loadRelaxed()->objectName()),
                       method.methodSignature().constData());
                c = c->nextConnectionList.loadRelaxed();
            }
        }
    } else {
        qDebug( "        <None>" );
    }

    // now look for connections where this object is the receiver
    qDebug("  SIGNALS IN");

    if (cd && cd->senders) {
        for (QObjectPrivate::Connection *s = cd->senders; s; s = s->next) {
            QByteArray slotName = QByteArrayLiteral("<unknown>");
            if (!s->isSlotObject) {
                const QMetaMethod slot = metaObject()->method(s->method());
                slotName = slot.methodSignature();
            }
            qDebug("          <-- %s::%s %s",
                   s->sender->metaObject()->className(),
                   s->sender->objectName().isEmpty() ? "unnamed" : qPrintable(s->sender->objectName()),
                   slotName.constData());
        }
    } else {
        qDebug("        <None>");
    }
}